

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMDCpp14.h
# Opt level: O2

_Unknown_bound __thiscall mmd::make_unique<pmx::PmxVertex[]>(mmd *this,size_t n)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  size_t *psVar4;
  long lVar5;
  PmxVertex *this_00;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = n;
  uVar2 = SUB168(auVar1 * ZEXT816(0x78),0);
  uVar3 = uVar2 + 8;
  if (0xfffffffffffffff7 < uVar2) {
    uVar3 = 0xffffffffffffffff;
  }
  uVar2 = 0xffffffffffffffff;
  if (SUB168(auVar1 * ZEXT816(0x78),8) == 0) {
    uVar2 = uVar3;
  }
  psVar4 = (size_t *)operator_new__(uVar2);
  *psVar4 = n;
  if (n != 0) {
    lVar5 = n * 0x78;
    this_00 = (PmxVertex *)(psVar4 + 1);
    do {
      pmx::PmxVertex::PmxVertex(this_00);
      this_00 = this_00 + 1;
      lVar5 = lVar5 + -0x78;
    } while (lVar5 != 0);
  }
  *(PmxVertex **)this = (PmxVertex *)(psVar4 + 1);
  return (__uniq_ptr_data<pmx::PmxVertex,_std::default_delete<pmx::PmxVertex[]>,_true,_true>)
         (__uniq_ptr_data<pmx::PmxVertex,_std::default_delete<pmx::PmxVertex[]>,_true,_true>)this;
}

Assistant:

typename _Unique_if<T>::_Unknown_bound
        make_unique(size_t n) {
            typedef typename std::remove_extent<T>::type U;
            return std::unique_ptr<T>(new U[n]());
        }